

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O3

CMStateSet * __thiscall xercesc_4_0::CMStateSet::operator=(CMStateSet *this,CMStateSet *srcSet)

{
  XMLSize_t index;
  long lVar1;
  RuntimeException *this_00;
  XMLInt32 *__src;
  XMLInt32 *__dest;
  CMDynamicBuffer *pCVar2;
  XMLSize_t index_00;
  
  if (this != srcSet) {
    pCVar2 = this->fDynamicBuffer;
    if (this->fBitCount != srcSet->fBitCount) {
      this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
      if (pCVar2 == (CMDynamicBuffer *)0x0) {
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
                   ,0x120,Bitset_NotEqualSize,(MemoryManager *)0x0);
      }
      else {
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
                   ,0x11e,Bitset_NotEqualSize,this->fDynamicBuffer->fMemoryManager);
      }
      __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
    }
    if (pCVar2 == (CMDynamicBuffer *)0x0) {
      lVar1 = 0;
      do {
        this->fBits[lVar1] = srcSet->fBits[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
    }
    else if (pCVar2->fArraySize != 0) {
      index_00 = 0;
      do {
        __src = srcSet->fDynamicBuffer->fBitArray[index_00];
        __dest = pCVar2->fBitArray[index_00];
        if (__src == (XMLInt32 *)0x0) {
          if (__dest != (XMLInt32 *)0x0) {
            deallocateChunk(this,index_00);
          }
        }
        else {
          if (__dest == (XMLInt32 *)0x0) {
            allocateChunk(this,index_00);
            __dest = this->fDynamicBuffer->fBitArray[index_00];
            __src = srcSet->fDynamicBuffer->fBitArray[index_00];
          }
          memcpy(__dest,__src,0x80);
        }
        index_00 = index_00 + 1;
        pCVar2 = this->fDynamicBuffer;
      } while (index_00 < pCVar2->fArraySize);
    }
  }
  return this;
}

Assistant:

CMStateSet& operator=(const CMStateSet& srcSet)
    {
        if (this == &srcSet)
            return *this;

        // They have to be the same size
        if (fBitCount != srcSet.fBitCount)
        {
            if(fDynamicBuffer)
                ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Bitset_NotEqualSize, fDynamicBuffer->fMemoryManager);
            else
                ThrowXML(RuntimeException, XMLExcepts::Bitset_NotEqualSize);
        }

        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                fBits[index] = srcSet.fBits[index];
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
                if(srcSet.fDynamicBuffer->fBitArray[index]==NULL)
                {
                    // delete this subentry
                    if(fDynamicBuffer->fBitArray[index]!=NULL)
                        deallocateChunk(index);
                }
                else
                {
                    // if we haven't allocated the subvector yet, allocate it and copy
                    if(fDynamicBuffer->fBitArray[index]==NULL)
                        allocateChunk(index);
                    memcpy((void *) fDynamicBuffer->fBitArray[index],
                           (const void *) srcSet.fDynamicBuffer->fBitArray[index],
                           CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                }
        }
        return *this;
    }